

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O0

double normalpdf(double x,double mu,double sigma)

{
  double dVar1;
  double dVar2;
  double t;
  double oup;
  double sigma_local;
  double mu_local;
  double x_local;
  
  if (sigma < 0.0) {
    printf("Standard Deviation (Sigma) must be non-negative");
    exit(1);
  }
  dVar1 = exp(-((x - mu) * (x - mu)) / (sigma * 2.0 * sigma));
  dVar2 = sqrt(6.283185307179586);
  return dVar1 / (dVar2 * sigma);
}

Assistant:

double normalpdf(double x, double mu, double sigma) {
	double oup,t;
	
	if (sigma < 0.) {
		printf("Standard Deviation (Sigma) must be non-negative");
		exit(1);
	}
	
	t = x - mu;
	t = t * t;
	
	oup = exp(-t / ( 2* sigma *sigma)) / ( sqrt(2 * PIVAL) * sigma);
	
	return oup;
}